

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_unix.cpp
# Opt level: O3

int __thiscall File::open(File *this,char *__file,int __oflag,...)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  uint in_ECX;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  pcVar1 = (char *)(this->m_name)._M_string_length;
  strlen(__file);
  std::__cxx11::string::_M_replace((ulong)&this->m_name,0,pcVar1,(ulong)__file);
  if (*(int *)&this->m_impl != -1) {
    (*(this->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3])(this);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__file,&local_71);
  extractFileDir(&local_70,&local_50);
  createDir(&local_70,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  uVar2 = anon_unknown.dwarf_4d6b97::makeUnixOpenFlags(__oflag);
  iVar3 = open64(__file,in_ECX | uVar2,0x1b0);
  this->m_impl = (void *)(long)iVar3;
  return (int)CONCAT71((int7)(int3)((uint)iVar3 >> 8),iVar3 != -1);
}

Assistant:

bool File::open(const char* fName, unsigned int oflag, unsigned int systemDependentFlags)
{
    m_name = fName;

    if (isOpen())
        close();

    int sysFlags = makeUnixOpenFlags(oflag);
    createDir(extractFileDir(fName), true);
    auto fd = ::open(fName, sysFlags | systemDependentFlags, S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP);
    m_impl = from_fd(fd);
    return fd != -1;
}